

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::findPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  btOverlapFilterCallback *pbVar1;
  int iVar2;
  btBroadphasePair *pbVar3;
  btBroadphaseProxy *pbVar4;
  long lVar5;
  
  pbVar1 = this->m_overlapFilterCallback;
  if (pbVar1 == (btOverlapFilterCallback *)0x0) {
    if ((ushort)(proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) == 0) {
      return (btBroadphasePair *)0x0;
    }
    if ((ushort)(proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) == 0) {
      return (btBroadphasePair *)0x0;
    }
  }
  else {
    iVar2 = (*pbVar1->_vptr_btOverlapFilterCallback[2])(pbVar1,proxy0,proxy1);
    if ((char)iVar2 == '\0') {
      return (btBroadphasePair *)0x0;
    }
  }
  pbVar4 = proxy0;
  if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
    pbVar4 = proxy1;
    proxy1 = proxy0;
  }
  iVar2 = (this->m_overlappingPairArray).m_size;
  if (0 < (long)iVar2) {
    pbVar3 = (this->m_overlappingPairArray).m_data;
    lVar5 = 0;
    do {
      if ((pbVar3->m_pProxy0 == proxy1) && (pbVar3->m_pProxy1 == pbVar4)) {
        if (iVar2 <= (int)lVar5) {
          return (btBroadphasePair *)0x0;
        }
        return pbVar3;
      }
      lVar5 = lVar5 + 1;
      pbVar3 = pbVar3 + 1;
    } while (iVar2 != lVar5);
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;

	btBroadphasePair tmpPair(*proxy0,*proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//btAssert(it != m_overlappingPairSet.end());
		 btBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}